

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifReduce.c
# Opt level: O2

int If_ManImproveNodeFaninCompact_int
              (If_Man_t *p,If_Obj_t *pObj,int nLimit,Vec_Ptr_t *vFront,Vec_Ptr_t *vVisited)

{
  int iVar1;
  int iVar2;
  int nLimit_00;
  
  iVar1 = If_ManImproveNodeFaninCompact0(p,pObj,nLimit,vFront,vVisited);
  iVar2 = 1;
  if (iVar1 == 0) {
    iVar1 = vFront->nSize;
    if (iVar1 < nLimit) {
      iVar2 = If_ManImproveNodeFaninCompact1(p,pObj,nLimit_00,vFront,vVisited);
      if (iVar2 != 0) {
        return 1;
      }
      iVar1 = vFront->nSize;
    }
    iVar2 = 0;
    if (nLimit < iVar1) {
      __assert_fail("Vec_PtrSize(vFront) <= nLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifReduce.c"
                    ,0x1b7,
                    "int If_ManImproveNodeFaninCompact_int(If_Man_t *, If_Obj_t *, int, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
  }
  return iVar2;
}

Assistant:

int If_ManImproveNodeFaninCompact_int( If_Man_t * p, If_Obj_t * pObj, int nLimit, Vec_Ptr_t * vFront, Vec_Ptr_t * vVisited )
{
    if ( If_ManImproveNodeFaninCompact0(p, pObj, nLimit, vFront, vVisited) )
        return 1;
    if (  Vec_PtrSize(vFront) < nLimit && If_ManImproveNodeFaninCompact1(p, pObj, nLimit, vFront, vVisited) )
        return 1;
//    if ( Vec_PtrSize(vFront) < nLimit && If_ManImproveNodeFaninCompact2(p, pObj, nLimit, vFront, vVisited) )
//        return 1;
    assert( Vec_PtrSize(vFront) <= nLimit );
    return 0;
}